

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expr.h
# Opt level: O0

void __thiscall
enact::ForExpr::ForExpr
          (ForExpr *this,Token *name,
          unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *object,
          unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *body)

{
  unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_> *body_local;
  unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *object_local;
  Token *name_local;
  ForExpr *this_local;
  
  Expr::Expr(&this->super_Expr);
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__ForExpr_0016a338;
  Token::Token(&this->name,name);
  std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::unique_ptr(&this->object,object);
  std::unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>::unique_ptr
            (&this->body,body);
  return;
}

Assistant:

ForExpr(Token name, std::unique_ptr<Expr> object, std::unique_ptr<BlockExpr> body) :
                name{std::move(name)},
                object{std::move(object)},
                body{std::move(body)} {}